

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMappingSparseMapped.cpp
# Opt level: O1

void __thiscall
RewardModelMappingSparseMapped::~RewardModelMappingSparseMapped
          (RewardModelMappingSparseMapped *this)

{
  ~RewardModelMappingSparseMapped(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

RewardModelMappingSparseMapped::~RewardModelMappingSparseMapped()
{
}